

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

Vec_Ptr_t * Vec_PtrDup(Vec_Ptr_t *pVec)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **__dest;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = pVec->nSize;
  pVVar3->nSize = iVar1;
  iVar2 = pVec->nCap;
  pVVar3->nCap = iVar2;
  if ((long)iVar2 == 0) {
    __dest = (void **)0x0;
  }
  else {
    __dest = (void **)malloc((long)iVar2 << 3);
  }
  pVVar3->pArray = __dest;
  memcpy(__dest,pVec->pArray,(long)iVar1 << 3);
  return pVVar3;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrDup( Vec_Ptr_t * pVec )
{
    Vec_Ptr_t * p;
    p = ABC_ALLOC( Vec_Ptr_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = p->nCap? ABC_ALLOC( void *, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(void *) * (size_t)pVec->nSize );
    return p;
}